

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O1

size_t sets_union<512ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  pointer pbVar1;
  _WordT *p_Var2;
  pointer pbVar3;
  unsigned_long uVar4;
  size_t __result;
  size_t sVar5;
  size_t i;
  long lVar6;
  long lVar7;
  value_type x;
  
  pbVar3 = (binary_sets->
           super__Vector_base<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pbVar1 = pbVar3 + c->_M_elems[0];
  x.super__Base_bitset<8UL>._M_w[0] = (pbVar1->super__Base_bitset<8UL>)._M_w[0];
  x.super__Base_bitset<8UL>._M_w[1] = (pbVar1->super__Base_bitset<8UL>)._M_w[1];
  x.super__Base_bitset<8UL>._M_w[2] = (pbVar1->super__Base_bitset<8UL>)._M_w[2];
  x.super__Base_bitset<8UL>._M_w[3] = (pbVar1->super__Base_bitset<8UL>)._M_w[3];
  x.super__Base_bitset<8UL>._M_w[4] = (pbVar1->super__Base_bitset<8UL>)._M_w[4];
  x.super__Base_bitset<8UL>._M_w[5] = (pbVar1->super__Base_bitset<8UL>)._M_w[5];
  x.super__Base_bitset<8UL>._M_w[6] = (pbVar1->super__Base_bitset<8UL>)._M_w[6];
  x.super__Base_bitset<8UL>._M_w[7] = (pbVar1->super__Base_bitset<8UL>)._M_w[7];
  lVar6 = 1;
  do {
    uVar4 = c->_M_elems[lVar6];
    lVar7 = 0;
    do {
      p_Var2 = x.super__Base_bitset<8UL>._M_w + lVar7;
      *p_Var2 = *p_Var2 | pbVar3[uVar4].super__Base_bitset<8UL>._M_w[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  lVar6 = 0;
  sVar5 = 0;
  do {
    sVar5 = sVar5 + POPCOUNT(x.super__Base_bitset<8UL>._M_w[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 8);
  return sVar5;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}